

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ECUPort.cc
# Opt level: O1

Values * __thiscall
SSM::ECUPort::singleRead(Values *__return_storage_ptr__,ECUPort *this,Observables *observables)

{
  undefined8 *puVar1;
  iterator __position;
  int iVar2;
  Observable **obs;
  undefined8 *puVar3;
  pointer pbVar4;
  Bytes response;
  Bytes local_48;
  double local_30;
  
  buildReadRequest(&local_48,this,observables,false);
  sendRequest(this,&local_48,3);
  if (local_48.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_48.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_48.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl
                          .super__Vector_impl_data._M_end_of_storage -
                    (long)local_48.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl
                          .super__Vector_impl_data._M_start);
  }
  readECUPacket(&local_48,this,false);
  (__return_storage_ptr__->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  puVar3 = *(undefined8 **)observables;
  puVar1 = *(undefined8 **)(observables + 8);
  if (puVar3 != puVar1) {
    pbVar4 = local_48.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
             super__Vector_impl_data._M_start + 5;
    do {
      local_30 = (double)(*(code *)**(undefined8 **)*puVar3)((undefined8 *)*puVar3,pbVar4);
      __position._M_current =
           (__return_storage_ptr__->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
           super__Vector_impl_data._M_finish;
      if (__position._M_current ==
          (__return_storage_ptr__->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<double,_std::allocator<double>_>::_M_realloc_insert<double>
                  (__return_storage_ptr__,__position,&local_30);
      }
      else {
        *__position._M_current = local_30;
        (__return_storage_ptr__->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
        super__Vector_impl_data._M_finish = __position._M_current + 1;
      }
      iVar2 = (**(code **)(*(long *)*puVar3 + 0x18))();
      pbVar4 = pbVar4 + iVar2;
      puVar3 = puVar3 + 1;
    } while (puVar3 != puVar1);
  }
  if (local_48.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_48.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_48.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl
                          .super__Vector_impl_data._M_end_of_storage -
                    (long)local_48.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl
                          .super__Vector_impl_data._M_start);
  }
  return __return_storage_ptr__;
}

Assistant:

Values ECUPort::singleRead(const Observables& observables) const
  {
    sendRequest(buildReadRequest(observables, false));

    Bytes response = readECUPacket(false);
    Bytes::const_iterator it = skipToData(response);
    Values values;
    for(const auto& obs: observables)
      {
	values.push_back(obs->convert(it));
	it += obs->numBytes();
      }
    
    return values;
  }